

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_QCOM_extended_get(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_QCOM_extended_get != 0) {
    glad_glExtGetTexturesQCOM = (PFNGLEXTGETTEXTURESQCOMPROC)(*load)("glExtGetTexturesQCOM");
    glad_glExtGetBuffersQCOM = (PFNGLEXTGETBUFFERSQCOMPROC)(*load)("glExtGetBuffersQCOM");
    glad_glExtGetRenderbuffersQCOM =
         (PFNGLEXTGETRENDERBUFFERSQCOMPROC)(*load)("glExtGetRenderbuffersQCOM");
    glad_glExtGetFramebuffersQCOM =
         (PFNGLEXTGETFRAMEBUFFERSQCOMPROC)(*load)("glExtGetFramebuffersQCOM");
    glad_glExtGetTexLevelParameterivQCOM =
         (PFNGLEXTGETTEXLEVELPARAMETERIVQCOMPROC)(*load)("glExtGetTexLevelParameterivQCOM");
    glad_glExtTexObjectStateOverrideiQCOM =
         (PFNGLEXTTEXOBJECTSTATEOVERRIDEIQCOMPROC)(*load)("glExtTexObjectStateOverrideiQCOM");
    glad_glExtGetTexSubImageQCOM =
         (PFNGLEXTGETTEXSUBIMAGEQCOMPROC)(*load)("glExtGetTexSubImageQCOM");
    glad_glExtGetBufferPointervQCOM =
         (PFNGLEXTGETBUFFERPOINTERVQCOMPROC)(*load)("glExtGetBufferPointervQCOM");
  }
  return;
}

Assistant:

static void load_GL_QCOM_extended_get(GLADloadproc load) {
	if(!GLAD_GL_QCOM_extended_get) return;
	glad_glExtGetTexturesQCOM = (PFNGLEXTGETTEXTURESQCOMPROC)load("glExtGetTexturesQCOM");
	glad_glExtGetBuffersQCOM = (PFNGLEXTGETBUFFERSQCOMPROC)load("glExtGetBuffersQCOM");
	glad_glExtGetRenderbuffersQCOM = (PFNGLEXTGETRENDERBUFFERSQCOMPROC)load("glExtGetRenderbuffersQCOM");
	glad_glExtGetFramebuffersQCOM = (PFNGLEXTGETFRAMEBUFFERSQCOMPROC)load("glExtGetFramebuffersQCOM");
	glad_glExtGetTexLevelParameterivQCOM = (PFNGLEXTGETTEXLEVELPARAMETERIVQCOMPROC)load("glExtGetTexLevelParameterivQCOM");
	glad_glExtTexObjectStateOverrideiQCOM = (PFNGLEXTTEXOBJECTSTATEOVERRIDEIQCOMPROC)load("glExtTexObjectStateOverrideiQCOM");
	glad_glExtGetTexSubImageQCOM = (PFNGLEXTGETTEXSUBIMAGEQCOMPROC)load("glExtGetTexSubImageQCOM");
	glad_glExtGetBufferPointervQCOM = (PFNGLEXTGETBUFFERPOINTERVQCOMPROC)load("glExtGetBufferPointervQCOM");
}